

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t cf_h2_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,CURLcode *err)

{
  uint uVar1;
  cf_h2_ctx *ctx_00;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  curl_off_t cVar5;
  bool bVar6;
  bool bVar7;
  _Bool _Var8;
  int iVar9;
  CURLcode CVar10;
  uint uVar11;
  int32_t iVar12;
  int32_t iVar13;
  long lVar14;
  size_t sVar15;
  size_t sVar16;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar17;
  Curl_easy *local_90;
  size_t rwin;
  int was_blocked;
  int blocked;
  CURLcode result;
  ssize_t nwritten;
  int rv;
  cf_call_data save;
  stream_ctx *stream;
  cf_h2_ctx *ctx;
  CURLcode *err_local;
  size_t len_local;
  void *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  ctx_00 = (cf_h2_ctx *)cf->ctx;
  if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
    local_90 = (Curl_easy *)0x0;
  }
  else {
    local_90 = (Curl_easy *)((data->req).p.http)->h2_ctx;
  }
  save.data = local_90;
  bVar7 = false;
  bVar6 = false;
  uVar2 = *(undefined8 *)((long)cf->ctx + 0x10);
  *(Curl_easy **)((long)cf->ctx + 0x10) = data;
  if ((local_90 == (Curl_easy *)0x0) || (local_90->magic == 0xffffffff)) {
    _blocked = h2_submit((stream_ctx **)&save,cf,data,buf,len,err);
    if ((long)_blocked < 0) goto LAB_00c03e1f;
  }
  else {
    lVar14._0_4_ = (local_90->req).deductheadercount;
    lVar14._4_4_ = (local_90->req).headerline;
    if (lVar14 == 0) {
      if (((ulong)(local_90->req).writer_stack & 0x10000000000) != 0) {
        if (((ulong)(local_90->req).writer_stack & 0x100000000) == 0) {
          if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          {
            Curl_infof(data,"stream %u closed",(ulong)local_90->magic);
          }
          *err = CURLE_SEND_ERROR;
          _blocked = 0xffffffffffffffff;
        }
        else {
          if ((((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
              (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"[%d] discarding dataon closed stream with response",
                              (ulong)local_90->magic);
          }
          *err = CURLE_OK;
          _blocked = len;
        }
        goto LAB_00c03e1f;
      }
      _blocked = Curl_bufq_write((bufq *)&(local_90->conn_queue).prev,(uchar *)buf,len,err);
      if (((long)_blocked < 0) && (*err != CURLE_AGAIN)) goto LAB_00c03e1f;
    }
    else {
      uVar3._0_4_ = (local_90->req).deductheadercount;
      uVar3._4_4_ = (local_90->req).headerline;
      if (len < uVar3) {
        uVar4._0_4_ = (local_90->req).deductheadercount;
        uVar4._4_4_ = (local_90->req).headerline;
        Curl_failf(data,"HTTP/2 send again with decreased length (%zd vs %zd)",len,uVar4);
        *err = CURLE_HTTP2;
        _blocked = 0xffffffffffffffff;
        goto LAB_00c03e1f;
      }
      blocked = (local_90->req).deductheadercount;
      result = (local_90->req).headerline;
      (local_90->req).deductheadercount = 0;
      (local_90->req).headerline = 0;
      bVar6 = true;
    }
    _Var8 = Curl_bufq_is_empty((bufq *)&((save.data)->conn_queue).prev);
    if (!_Var8) {
      iVar9 = nghttp2_session_resume_data(ctx_00->h2,(save.data)->magic);
      iVar9 = nghttp2_is_fatal(iVar9);
      if (iVar9 != 0) {
        *err = CURLE_SEND_ERROR;
        _blocked = 0xffffffffffffffff;
        goto LAB_00c03e1f;
      }
    }
  }
  CVar10 = h2_progress_egress(cf,data);
  if (((save.data == (Curl_easy *)0x0) ||
      (((ulong)((save.data)->req).writer_stack & 0x10000000000) == 0)) || (bVar6)) {
    if (CVar10 == CURLE_AGAIN) {
      bVar7 = true;
    }
    else {
      if (CVar10 != CURLE_OK) {
        *err = CVar10;
        _blocked = 0xffffffffffffffff;
        goto LAB_00c03e1f;
      }
      if ((save.data != (Curl_easy *)0x0) &&
         (_Var8 = Curl_bufq_is_empty((bufq *)&((save.data)->conn_queue).prev), !_Var8)) {
        bVar7 = true;
      }
    }
    if (((save.data == (Curl_easy *)0x0) || (!bVar7)) || ((long)_blocked < 1)) {
      iVar9 = should_close_session(ctx_00);
      if (iVar9 != 0) {
        if (((ulong)((save.data)->req).writer_stack & 0x10000000000) == 0) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)
              ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
            Curl_trc_cf_infof(data,cf,"send: nothing to do in this session");
          }
          *err = CURLE_HTTP2;
          _blocked = 0xffffffffffffffff;
        }
        else {
          _blocked = http2_handle_stream_close(cf,data,(stream_ctx *)save.data,err);
        }
      }
    }
    else {
      iVar12 = nghttp2_session_get_stream_remote_window_size(ctx_00->h2,(save.data)->magic);
      lVar14 = (long)iVar12;
      ((save.data)->req).deductheadercount = blocked;
      ((save.data)->req).headerline = result;
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        uVar1 = (save.data)->magic;
        uVar11 = nghttp2_session_get_remote_window_size(ctx_00->h2);
        Curl_trc_cf_infof(data,cf,"[%d] cf_send(len=%zu) BLOCK: win %u/%zu blocked_len=%zu",
                          (ulong)uVar1,len,(ulong)uVar11,lVar14,_blocked);
        uVar17 = (undefined4)((ulong)lVar14 >> 0x20);
      }
      *err = CURLE_AGAIN;
      _blocked = 0xffffffffffffffff;
    }
  }
  else {
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      Curl_infof(data,"stream %u closed",(ulong)(save.data)->magic);
    }
    *err = CURLE_SEND_ERROR;
    _blocked = 0xffffffffffffffff;
  }
LAB_00c03e1f:
  if (save.data == (Curl_easy *)0x0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      CVar10 = *err;
      iVar12 = nghttp2_session_get_remote_window_size(ctx_00->h2);
      sVar15 = Curl_bufq_len(&ctx_00->outbufq);
      Curl_trc_cf_infof(data,cf,
                        "cf_send(len=%zu) -> %zd, %d, connection-window=%d, nw_send_buffer(%zu)",len
                        ,_blocked,(ulong)CVar10,CONCAT44(uVar17,iVar12),sVar15);
    }
  }
  else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    uVar1 = (save.data)->magic;
    CVar10 = *err;
    cVar5 = ((save.data)->req).offset;
    iVar12 = nghttp2_session_get_stream_remote_window_size(ctx_00->h2,(save.data)->magic);
    iVar13 = nghttp2_session_get_remote_window_size(ctx_00->h2);
    sVar15 = Curl_bufq_len((bufq *)&((save.data)->conn_queue).prev);
    sVar16 = Curl_bufq_len(&ctx_00->outbufq);
    Curl_trc_cf_infof(data,cf,
                      "[%d] cf_send(len=%zu) -> %zd, %d, upload_left=%ld, h2 windows %d-%d (stream-conn), buffers %zu-%zu (stream-conn)"
                      ,(ulong)uVar1,len,_blocked,CONCAT44(uVar17,CVar10),cVar5,iVar12,iVar13,sVar15,
                      sVar16);
  }
  *(undefined8 *)((long)cf->ctx + 0x10) = uVar2;
  return _blocked;
}

Assistant:

static ssize_t cf_h2_send(struct Curl_cfilter *cf, struct Curl_easy *data,
                          const void *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  struct cf_call_data save;
  int rv;
  ssize_t nwritten;
  CURLcode result;
  int blocked = 0, was_blocked = 0;

  CF_DATA_SAVE(save, cf, data);

  if(stream && stream->id != -1) {
    if(stream->upload_blocked_len) {
      /* the data in `buf` has already been submitted or added to the
       * buffers, but have been EAGAINed on the last invocation. */
      /* TODO: this assertion triggers in OSSFuzz runs and it is not
       * clear why. Disable for now to let OSSFuzz continue its tests. */
      DEBUGASSERT(len >= stream->upload_blocked_len);
      if(len < stream->upload_blocked_len) {
        /* Did we get called again with a smaller `len`? This should not
         * happen. We are not prepared to handle that. */
        failf(data, "HTTP/2 send again with decreased length (%zd vs %zd)",
              len, stream->upload_blocked_len);
        *err = CURLE_HTTP2;
        nwritten = -1;
        goto out;
      }
      nwritten = (ssize_t)stream->upload_blocked_len;
      stream->upload_blocked_len = 0;
      was_blocked = 1;
    }
    else if(stream->closed) {
      if(stream->resp_hds_complete) {
        /* Server decided to close the stream after having sent us a findl
         * response. This is valid if it is not interested in the request
         * body. This happens on 30x or 40x responses.
         * We silently discard the data sent, since this is not a transport
         * error situation. */
        CURL_TRC_CF(data, cf, "[%d] discarding data"
                    "on closed stream with response", stream->id);
        *err = CURLE_OK;
        nwritten = (ssize_t)len;
        goto out;
      }
      infof(data, "stream %u closed", stream->id);
      *err = CURLE_SEND_ERROR;
      nwritten = -1;
      goto out;
    }
    else {
      /* If stream_id != -1, we have dispatched request HEADERS and
       * optionally request body, and now are going to send or sending
       * more request body in DATA frame */
      nwritten = Curl_bufq_write(&stream->sendbuf, buf, len, err);
      if(nwritten < 0 && *err != CURLE_AGAIN)
        goto out;
    }

    if(!Curl_bufq_is_empty(&stream->sendbuf)) {
      /* req body data is buffered, resume the potentially suspended stream */
      rv = nghttp2_session_resume_data(ctx->h2, stream->id);
      if(nghttp2_is_fatal(rv)) {
        *err = CURLE_SEND_ERROR;
        nwritten = -1;
        goto out;
      }
    }
  }
  else {
    nwritten = h2_submit(&stream, cf, data, buf, len, err);
    if(nwritten < 0) {
      goto out;
    }
    DEBUGASSERT(stream);
  }

  /* Call the nghttp2 send loop and flush to write ALL buffered data,
   * headers and/or request body completely out to the network */
  result = h2_progress_egress(cf, data);
  /* if the stream has been closed in egress handling (nghttp2 does that
   * when it does not like the headers, for example */
  if(stream && stream->closed && !was_blocked) {
    infof(data, "stream %u closed", stream->id);
    *err = CURLE_SEND_ERROR;
    nwritten = -1;
    goto out;
  }
  else if(result == CURLE_AGAIN) {
    blocked = 1;
  }
  else if(result) {
    *err = result;
    nwritten = -1;
    goto out;
  }
  else if(stream && !Curl_bufq_is_empty(&stream->sendbuf)) {
    /* although we wrote everything that nghttp2 wants to send now,
     * there is data left in our stream send buffer unwritten. This may
     * be due to the stream's HTTP/2 flow window being exhausted. */
    blocked = 1;
  }

  if(stream && blocked && nwritten > 0) {
    /* Unable to send all data, due to connection blocked or H2 window
     * exhaustion. Data is left in our stream buffer, or nghttp2's internal
     * frame buffer or our network out buffer. */
    size_t rwin = nghttp2_session_get_stream_remote_window_size(ctx->h2,
                                                                stream->id);
    /* Whatever the cause, we need to return CURL_EAGAIN for this call.
     * We have unwritten state that needs us being invoked again and EAGAIN
     * is the only way to ensure that. */
    stream->upload_blocked_len = nwritten;
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) BLOCK: win %u/%zu "
                "blocked_len=%zu",
                stream->id, len,
                nghttp2_session_get_remote_window_size(ctx->h2), rwin,
                nwritten);
    *err = CURLE_AGAIN;
    nwritten = -1;
    goto out;
  }
  else if(should_close_session(ctx)) {
    /* nghttp2 thinks this session is done. If the stream has not been
     * closed, this is an error state for out transfer */
    if(stream->closed) {
      nwritten = http2_handle_stream_close(cf, data, stream, err);
    }
    else {
      CURL_TRC_CF(data, cf, "send: nothing to do in this session");
      *err = CURLE_HTTP2;
      nwritten = -1;
    }
  }

out:
  if(stream) {
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) -> %zd, %d, "
                "upload_left=%" CURL_FORMAT_CURL_OFF_T ", "
                "h2 windows %d-%d (stream-conn), "
                "buffers %zu-%zu (stream-conn)",
                stream->id, len, nwritten, *err,
                stream->upload_left,
                nghttp2_session_get_stream_remote_window_size(
                  ctx->h2, stream->id),
                nghttp2_session_get_remote_window_size(ctx->h2),
                Curl_bufq_len(&stream->sendbuf),
                Curl_bufq_len(&ctx->outbufq));
  }
  else {
    CURL_TRC_CF(data, cf, "cf_send(len=%zu) -> %zd, %d, "
                "connection-window=%d, nw_send_buffer(%zu)",
                len, nwritten, *err,
                nghttp2_session_get_remote_window_size(ctx->h2),
                Curl_bufq_len(&ctx->outbufq));
  }
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}